

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  U32 *pUVar2;
  ZSTD_cwksp_alloc_phase_e ZVar3;
  size_t sVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ZSTD_customMem customMem;
  uint uVar9;
  uint uVar10;
  ZSTD_strategy ZVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  size_t size;
  void *pvVar18;
  U32 *pUVar19;
  BYTE *pBVar20;
  size_t sVar21;
  ZSTD_compressedBlockState_t *pZVar22;
  BYTE *pBVar23;
  seqDef *psVar24;
  ulong uVar25;
  size_t sVar26;
  size_t err_code;
  size_t sVar27;
  void *pvVar28;
  rawSeq *prVar29;
  ldmEntry_t *__s;
  ulong maxChunkSize;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  ZSTD_indexResetPolicy_e local_90;
  size_t local_80;
  
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xb0);
  params_00 = &(zc->appliedParams).ldmParams;
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
  }
  uVar30 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= uVar30) {
    uVar30 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar30 = 1;
  }
  maxChunkSize = 0x20000;
  if (uVar30 < 0x20000) {
    maxChunkSize = uVar30;
  }
  uVar31 = (ulong)((zc->appliedParams).cParams.minMatch != 3) + 3;
  sVar21 = 0;
  uVar16 = maxChunkSize / uVar31;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      uVar25 = 0;
      if (uVar30 < 0x20000) {
        uVar25 = (ulong)(0x20000U - (int)maxChunkSize >> 0xb);
      }
      sVar21 = uVar25 + (maxChunkSize >> 8) + maxChunkSize + 1;
    }
    else {
      sVar21 = 0;
    }
  }
  if (zbuff == ZSTDb_buffered) {
    local_80 = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      local_80 = maxChunkSize + uVar30;
    }
  }
  else {
    local_80 = 0;
  }
  cParams = &(zc->appliedParams).cParams;
  sVar17 = ZSTD_ldm_getMaxNbSeq(*params_00,maxChunkSize);
  local_90 = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    local_90 = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  size = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                   (cParams,params_00,(uint)(zc->staticSize != 0),
                    (zc->appliedParams).useRowMatchFinder,local_80,sVar21,pledgedSrcSize);
  if (0xffffffffffffff88 < size) {
    return size;
  }
  sVar4 = zc->staticSize;
  if (sVar4 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar18 = (zc->workspace).workspace;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < size * 3) {
    bVar6 = false;
  }
  else {
    bVar6 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  bVar32 = (ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar18) < size;
  bVar7 = (bool)(bVar32 | bVar6);
  bVar8 = (bool)(bVar7 ^ 1);
  sVar27 = 0xffffffffffffffc0;
  if (!(bool)(bVar32 | bVar6)) {
    sVar27 = size;
  }
  if ((sVar4 == 0) && (bVar7)) {
    customMem = zc->customMem;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x31 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    (zc->workspace).workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    ZSTD_customFree(pvVar18,customMem);
    pvVar18 = ZSTD_customMalloc(size,zc->customMem);
    if (pvVar18 == (void *)0x0) {
      sVar27 = 0xffffffffffffffc0;
      local_90 = ZSTDirp_reset;
      bVar8 = false;
    }
    else {
      (zc->workspace).workspace = pvVar18;
      (zc->workspace).workspaceEnd = (void *)(size + (long)pvVar18);
      (zc->workspace).objectEnd = pvVar18;
      (zc->workspace).tableValidEnd = pvVar18;
      (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
      (zc->workspace).tableEnd = pvVar18;
      (zc->workspace).allocStart = (void *)(size + (long)pvVar18);
      (zc->workspace).allocFailed = '\0';
      (zc->workspace).workspaceOversizedDuration = 0;
      (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
      ZVar3 = (zc->workspace).phase;
      if (ZVar3 == ZSTD_cwksp_alloc_objects) {
        pZVar22 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
        pZVar5 = pZVar22 + 1;
        if ((ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar5) goto LAB_006e2dd0;
        (zc->workspace).objectEnd = pZVar5;
        (zc->workspace).tableEnd = pZVar5;
        (zc->workspace).tableValidEnd = pZVar5;
      }
      else {
LAB_006e2dd0:
        (zc->workspace).allocFailed = '\x01';
        pZVar22 = (ZSTD_compressedBlockState_t *)0x0;
      }
      (zc->blockState).prevCBlock = pZVar22;
      if (pZVar22 != (ZSTD_compressedBlockState_t *)0x0) {
        if (ZVar3 == ZSTD_cwksp_alloc_objects) {
          pZVar22 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
          pZVar5 = pZVar22 + 1;
          if ((ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar5)
          goto LAB_006e2e04;
          (zc->workspace).objectEnd = pZVar5;
          (zc->workspace).tableEnd = pZVar5;
          (zc->workspace).tableValidEnd = pZVar5;
        }
        else {
LAB_006e2e04:
          (zc->workspace).allocFailed = '\x01';
          pZVar22 = (ZSTD_compressedBlockState_t *)0x0;
        }
        local_90 = ZSTDirp_reset;
        (zc->blockState).nextCBlock = pZVar22;
        if (pZVar22 != (ZSTD_compressedBlockState_t *)0x0) {
          if (ZVar3 == ZSTD_cwksp_alloc_objects) {
            pUVar19 = (U32 *)(zc->workspace).objectEnd;
            pUVar2 = pUVar19 + 0x676;
            if ((zc->workspace).workspaceEnd < pUVar2) goto LAB_006e2e40;
            (zc->workspace).objectEnd = pUVar2;
            (zc->workspace).tableEnd = pUVar2;
            (zc->workspace).tableValidEnd = pUVar2;
          }
          else {
LAB_006e2e40:
            (zc->workspace).allocFailed = '\x01';
            pUVar19 = (U32 *)0x0;
          }
          zc->entropyWorkspace = pUVar19;
          bVar8 = true;
          sVar27 = size;
          goto LAB_006e2e71;
        }
      }
      local_90 = ZSTDirp_reset;
      bVar8 = false;
      sVar27 = 0xffffffffffffffc0;
    }
  }
LAB_006e2e71:
  if (!bVar8) {
    return sVar27;
  }
  (zc->workspace).tableEnd = (zc->workspace).objectEnd;
  (zc->workspace).allocStart = (zc->workspace).workspaceEnd;
  (zc->workspace).allocFailed = '\0';
  if (ZSTD_cwksp_alloc_buffers < (zc->workspace).phase) {
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  uVar12 = cParams->windowLog;
  uVar13 = cParams->chainLog;
  uVar14 = (zc->appliedParams).cParams.hashLog;
  uVar15 = (zc->appliedParams).cParams.searchLog;
  uVar9 = (zc->appliedParams).cParams.minMatch;
  uVar10 = (zc->appliedParams).cParams.targetLength;
  ZVar11 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar9;
  (zc->blockState).matchState.cParams.targetLength = uVar10;
  (zc->blockState).matchState.cParams.strategy = ZVar11;
  (zc->blockState).matchState.cParams.windowLog = uVar12;
  (zc->blockState).matchState.cParams.chainLog = uVar13;
  (zc->blockState).matchState.cParams.hashLog = uVar14;
  (zc->blockState).matchState.cParams.searchLog = uVar15;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = maxChunkSize;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  pZVar5 = (zc->blockState).prevCBlock;
  pZVar5->rep[0] = 1;
  pZVar5->rep[1] = 4;
  pZVar5->rep[2] = 8;
  (pZVar5->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar5->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar5->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar5->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  pBVar20 = (BYTE *)(zc->workspace).tableEnd;
  pBVar23 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - maxChunkSize));
  if (pBVar23 < pBVar20) {
    (zc->workspace).allocFailed = '\x01';
    pBVar23 = (BYTE *)0x0;
  }
  else {
    if (pBVar23 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar23;
    }
    (zc->workspace).allocStart = pBVar23;
  }
  (zc->seqStore).litStart = pBVar23;
  (zc->seqStore).maxNbLit = maxChunkSize;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = local_80;
  if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  if (local_80 == 0) {
LAB_006e3023:
    pBVar23 = (BYTE *)0x0;
  }
  else {
    pBVar23 = (BYTE *)((long)(zc->workspace).allocStart - local_80);
    if (pBVar23 < pBVar20) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e3023;
    }
    if (pBVar23 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar23;
    }
    (zc->workspace).allocStart = pBVar23;
  }
  zc->inBuff = (char *)pBVar23;
  zc->outBuffSize = sVar21;
  if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  if (sVar21 == 0) {
LAB_006e3088:
    pBVar23 = (BYTE *)0x0;
  }
  else {
    pBVar23 = (BYTE *)((long)(zc->workspace).allocStart - sVar21);
    if (pBVar23 < pBVar20) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e3088;
    }
    if (pBVar23 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar23;
    }
    (zc->workspace).allocStart = pBVar23;
  }
  zc->outBuff = (char *)pBVar23;
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    sVar26 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                    (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
    }
    pBVar23 = (BYTE *)((long)(zc->workspace).allocStart - sVar26);
    if (pBVar23 < pBVar20) {
      (zc->workspace).allocFailed = '\x01';
      pBVar23 = (BYTE *)0x0;
    }
    else {
      if (pBVar23 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar23;
      }
      (zc->workspace).allocStart = pBVar23;
    }
    (zc->ldmState).bucketOffsets = pBVar23;
    memset(pBVar23,0,sVar26);
  }
  if ((zc->stage == ZSTDcs_init) && (params_00->enableLdm == 0)) {
    (zc->externSeqStore).posInSequence = 0;
    (zc->externSeqStore).size = 0;
    (zc->externSeqStore).seq = (rawSeq *)0x0;
    (zc->externSeqStore).pos = 0;
    (zc->externSeqStore).capacity = 0;
  }
  (zc->seqStore).maxNbSeq = uVar16;
  if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  if (uVar30 < uVar31) {
LAB_006e3199:
    pBVar20 = (BYTE *)0x0;
  }
  else {
    pBVar20 = (BYTE *)((long)(zc->workspace).allocStart - uVar16);
    if (pBVar20 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e3199;
    }
    if (pBVar20 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar20;
    }
    (zc->workspace).allocStart = pBVar20;
  }
  (zc->seqStore).llCode = pBVar20;
  if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  if (uVar30 < uVar31) {
LAB_006e31fb:
    pBVar20 = (BYTE *)0x0;
  }
  else {
    pBVar20 = (BYTE *)((long)(zc->workspace).allocStart - uVar16);
    if (pBVar20 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e31fb;
    }
    if (pBVar20 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar20;
    }
    (zc->workspace).allocStart = pBVar20;
  }
  (zc->seqStore).mlCode = pBVar20;
  if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  if (uVar30 < uVar31) {
LAB_006e325d:
    pBVar20 = (BYTE *)0x0;
  }
  else {
    pBVar20 = (BYTE *)((long)(zc->workspace).allocStart - uVar16);
    if (pBVar20 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e325d;
    }
    if (pBVar20 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar20;
    }
    (zc->workspace).allocStart = pBVar20;
  }
  (zc->seqStore).ofCode = pBVar20;
  uVar30 = (ulong)((int)uVar16 * 8 + 0x3fU & 0x3fffc0);
  ZVar3 = (zc->workspace).phase;
  if (ZVar3 < ZSTD_cwksp_alloc_aligned) {
    if (ZVar3 == ZSTD_cwksp_alloc_objects) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    }
    pvVar18 = (zc->workspace).tableEnd;
    pvVar28 = (zc->workspace).allocStart;
    pvVar28 = (void *)(((ulong)(uint)-(int)pvVar28 | 0xffffffffffffffc0) + (long)pvVar28);
    if (pvVar28 < pvVar18) {
      (zc->workspace).allocFailed = '\x01';
    }
    else {
      if (pvVar28 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pvVar28;
      }
      (zc->workspace).allocStart = pvVar28;
    }
    bVar6 = true;
    if ((pvVar18 <= pvVar28) &&
       (pvVar18 = (zc->workspace).objectEnd,
       pvVar18 = (void *)((ulong)(-(int)pvVar18 & 0x3f) + (long)pvVar18),
       pvVar18 <= (zc->workspace).workspaceEnd)) {
      (zc->workspace).objectEnd = pvVar18;
      (zc->workspace).tableEnd = pvVar18;
      (zc->workspace).tableValidEnd = pvVar18;
      (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_006e332b;
    }
  }
  else {
LAB_006e332b:
    bVar6 = false;
  }
  if (uVar30 == 0 || bVar6) {
LAB_006e3358:
    psVar24 = (seqDef *)0x0;
  }
  else {
    psVar24 = (seqDef *)((long)(zc->workspace).allocStart - uVar30);
    if (psVar24 < (seqDef *)(zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e3358;
    }
    if (psVar24 < (seqDef *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = psVar24;
    }
    (zc->workspace).allocStart = psVar24;
  }
  (zc->seqStore).sequencesStart = psVar24;
  sVar21 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,&zc->workspace,cParams,
                      (zc->appliedParams).useRowMatchFinder,crp,local_90,ZSTD_resetTarget_CCtx);
  if (0xffffffffffffff88 < sVar21) {
    return sVar21;
  }
  if (params_00->enableLdm == 0) goto LAB_006e363f;
  sVar26 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
  uVar30 = sVar26 + 0x3f & 0xffffffffffffffc0;
  ZVar3 = (zc->workspace).phase;
  if (ZVar3 < ZSTD_cwksp_alloc_aligned) {
    if (ZVar3 == ZSTD_cwksp_alloc_objects) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    }
    pvVar18 = (zc->workspace).tableEnd;
    pvVar28 = (zc->workspace).allocStart;
    pvVar28 = (void *)(((ulong)(uint)-(int)pvVar28 | 0xffffffffffffffc0) + (long)pvVar28);
    if (pvVar28 < pvVar18) {
      (zc->workspace).allocFailed = '\x01';
    }
    else {
      if (pvVar28 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pvVar28;
      }
      (zc->workspace).allocStart = pvVar28;
    }
    bVar6 = true;
    if ((pvVar18 <= pvVar28) &&
       (pvVar18 = (zc->workspace).objectEnd,
       pvVar18 = (void *)((ulong)(-(int)pvVar18 & 0x3f) + (long)pvVar18),
       pvVar18 <= (zc->workspace).workspaceEnd)) {
      (zc->workspace).objectEnd = pvVar18;
      (zc->workspace).tableEnd = pvVar18;
      (zc->workspace).tableValidEnd = pvVar18;
      (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_006e348b;
    }
  }
  else {
LAB_006e348b:
    bVar6 = false;
  }
  if (uVar30 == 0 || bVar6) {
LAB_006e34b3:
    __s = (ldmEntry_t *)0x0;
  }
  else {
    __s = (ldmEntry_t *)((long)(zc->workspace).allocStart - uVar30);
    if (__s < (ldmEntry_t *)(zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e34b3;
    }
    if (__s < (ldmEntry_t *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = __s;
    }
    (zc->workspace).allocStart = __s;
  }
  (zc->ldmState).hashTable = __s;
  bVar6 = false;
  memset(__s,0,sVar26);
  uVar30 = sVar17 * 0xc + 0x3f & 0xffffffffffffffc0;
  ZVar3 = (zc->workspace).phase;
  if (ZVar3 < ZSTD_cwksp_alloc_aligned) {
    if (ZVar3 == ZSTD_cwksp_alloc_objects) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    }
    pvVar18 = (zc->workspace).tableEnd;
    pvVar28 = (zc->workspace).allocStart;
    pvVar28 = (void *)(((ulong)(uint)-(int)pvVar28 | 0xffffffffffffffc0) + (long)pvVar28);
    if (pvVar28 < pvVar18) {
      (zc->workspace).allocFailed = '\x01';
    }
    else {
      if (pvVar28 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pvVar28;
      }
      (zc->workspace).allocStart = pvVar28;
    }
    bVar6 = true;
    if ((pvVar18 <= pvVar28) &&
       (pvVar18 = (zc->workspace).objectEnd,
       pvVar18 = (void *)((ulong)(-(int)pvVar18 & 0x3f) + (long)pvVar18),
       pvVar18 <= (zc->workspace).workspaceEnd)) {
      (zc->workspace).objectEnd = pvVar18;
      (zc->workspace).tableEnd = pvVar18;
      (zc->workspace).tableValidEnd = pvVar18;
      (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
      bVar6 = false;
    }
  }
  if (uVar30 == 0 || bVar6) {
LAB_006e35c4:
    prVar29 = (rawSeq *)0x0;
  }
  else {
    prVar29 = (rawSeq *)((long)(zc->workspace).allocStart - uVar30);
    if (prVar29 < (rawSeq *)(zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_006e35c4;
    }
    if (prVar29 < (rawSeq *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = prVar29;
    }
    (zc->workspace).allocStart = prVar29;
  }
  zc->ldmSequences = prVar29;
  zc->maxNbLdmSequences = sVar17;
  (zc->ldmState).window.dictBase = (BYTE *)0x0;
  (zc->ldmState).window.dictLimit = 0;
  (zc->ldmState).window.lowLimit = 0;
  (zc->ldmState).window.nextSrc = (BYTE *)0x0;
  (zc->ldmState).window.base = (BYTE *)0x0;
  *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
  (zc->ldmState).window.base = "";
  (zc->ldmState).window.dictBase = "";
  (zc->ldmState).window.dictLimit = 1;
  (zc->ldmState).window.lowLimit = 1;
  (zc->ldmState).window.nextSrc = (BYTE *)"PK\x06\x06";
  (zc->ldmState).window.nbOverflowCorrections = 0;
  (zc->ldmState).loadedDictEnd = 0;
LAB_006e363f:
  zc->initialized = 1;
  return 0;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_urm_auto);
    if (params->ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params->cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params->cParams,
            params->useRowMatchFinder,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx), "");

        /* ldm hash table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace, resizeWorkspace));
        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));

        zc->initialized = 1;

        return 0;
    }
}